

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::stable_distribute_inplace<std::pair<int,int>>
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *param_1,
               comm *comm)

{
  comm *comm_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_els_local;
  
  impl::
  distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  stable_distribute_inplace(param_1,comm);
  return;
}

Assistant:

void stable_distribute_inplace(std::vector<T>& local_els, const mxx::comm& comm) {
    impl::distribute_container<std::vector<T>>::stable_distribute_inplace(local_els, comm);
}